

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O3

int __thiscall ktx::CommandHelp::main(CommandHelp *this,int argc,char **argv)

{
  string local_78;
  string local_50;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ktx help","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Displays the man page of a specific ktx command specified as the command argument.\nIf the command option is missing the main ktx tool man page will be displayed."
             ,"");
  Command::parseCommandLine(&this->super_Command,&local_78,&local_50,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  executeHelp(this);
  return 0;
}

Assistant:

int CommandHelp::main(int argc, char* argv[]) {
    try {
        parseCommandLine("ktx help",
                "Displays the man page of a specific ktx command specified as the command argument."
                "\nIf the command option is missing the main ktx tool man page will be displayed.",
                argc, argv);
        executeHelp();
        return +rc::SUCCESS;
    } catch (const FatalError& error) {
        return +error.returnCode;
    } catch (const std::exception& e) {
        fmt::print(std::cerr, "{} fatal: {}\n", commandName, e.what());
        return +rc::RUNTIME_ERROR;
    }
}